

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btConvexHullInternal::Point32>::quickSortInternal<pointCmp>
          (btAlignedObjectArray<btConvexHullInternal::Point32> *this,pointCmp *CompareFunc,int lo,
          int hi)

{
  Point32 *pPVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  int index1;
  long lVar5;
  int index0;
  long lVar6;
  Point32 x;
  
  pPVar1 = this->m_data + (hi + lo) / 2;
  x.x = pPVar1->x;
  x.y = pPVar1->y;
  x.z = pPVar1->z;
  x.index = pPVar1->index;
  index1 = hi;
  index0 = lo;
  do {
    lVar5 = (long)index0 + -1;
    lVar4 = (long)index0 << 4;
    iVar2 = index0;
    do {
      index0 = iVar2;
      bVar3 = pointCmp::operator()(CompareFunc,(Point32 *)((long)&this->m_data->x + lVar4),&x);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x10;
      iVar2 = index0 + 1;
    } while (bVar3);
    lVar4 = (long)index1 + 1;
    lVar6 = (long)index1 << 4;
    iVar2 = index1;
    do {
      index1 = iVar2;
      bVar3 = pointCmp::operator()(CompareFunc,&x,(Point32 *)((long)&this->m_data->x + lVar6));
      lVar4 = lVar4 + -1;
      lVar6 = lVar6 + -0x10;
      iVar2 = index1 + -1;
    } while (bVar3);
    if (lVar5 <= lVar4) {
      swap(this,index0,index1);
      index1 = index1 + -1;
      index0 = index0 + 1;
    }
  } while (index0 <= index1);
  if (lo < index1) {
    quickSortInternal<pointCmp>(this,CompareFunc,lo,index1);
  }
  if (index0 < hi) {
    quickSortInternal<pointCmp>(this,CompareFunc,index0,hi);
  }
  return;
}

Assistant:

void quickSortInternal(const L& CompareFunc,int lo, int hi)
		{
		//  lo is the lower index, hi is the upper index
		//  of the region of array a that is to be sorted
			int i=lo, j=hi;
			T x=m_data[(lo+hi)/2];

			//  partition
			do
			{    
				while (CompareFunc(m_data[i],x)) 
					i++; 
				while (CompareFunc(x,m_data[j])) 
					j--;
				if (i<=j)
				{
					swap(i,j);
					i++; j--;
				}
			} while (i<=j);

			//  recursion
			if (lo<j) 
				quickSortInternal( CompareFunc, lo, j);
			if (i<hi) 
				quickSortInternal( CompareFunc, i, hi);
		}